

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int emit_server_name_extension(ptls_buffer_t *buf,char *server_name)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  size_t delta;
  long lVar4;
  ulong uVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  
  iVar3 = ptls_buffer_reserve(buf,2);
  if (iVar3 == 0) {
    puVar1 = buf->base;
    sVar7 = buf->off;
    (puVar1 + sVar7)[0] = '\0';
    (puVar1 + sVar7)[1] = '\0';
    buf->off = buf->off + 2;
    iVar3 = 0;
  }
  iVar6 = 6;
  if (iVar3 != 0) goto LAB_00110d94;
  sVar7 = buf->off;
  iVar3 = ptls_buffer_reserve(buf,1);
  if (iVar3 == 0) {
    buf->base[buf->off] = '\0';
    buf->off = buf->off + 1;
    iVar3 = 0;
  }
  if (iVar3 != 0) goto LAB_00110d94;
  iVar3 = ptls_buffer_reserve(buf,2);
  if (iVar3 == 0) {
    puVar1 = buf->base;
    sVar8 = buf->off;
    (puVar1 + sVar8)[0] = '\0';
    (puVar1 + sVar8)[1] = '\0';
    buf->off = buf->off + 2;
    iVar3 = 0;
  }
  iVar6 = 6;
  bVar2 = false;
  if (iVar3 == 0) {
    sVar8 = buf->off;
    delta = strlen(server_name);
    if (delta == 0) {
LAB_00110d32:
      iVar3 = 0;
    }
    else {
      iVar3 = ptls_buffer_reserve(buf,delta);
      if (iVar3 == 0) {
        memcpy(buf->base + buf->off,server_name,delta);
        buf->off = buf->off + delta;
        goto LAB_00110d32;
      }
    }
    if (iVar3 == 0) {
      uVar5 = buf->off - sVar8;
      lVar4 = 8;
      do {
        buf->base[sVar8 - 2] = (uint8_t)(uVar5 >> ((byte)lVar4 & 0x3f));
        lVar4 = lVar4 + -8;
        sVar8 = sVar8 + 1;
      } while (lVar4 != -8);
      iVar6 = 0;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  if (bVar2) {
    uVar5 = buf->off - sVar7;
    lVar4 = 8;
    do {
      buf->base[sVar7 - 2] = (uint8_t)(uVar5 >> ((byte)lVar4 & 0x3f));
      lVar4 = lVar4 + -8;
      sVar7 = sVar7 + 1;
    } while (lVar4 != -8);
    iVar6 = 0;
  }
LAB_00110d94:
  if (iVar6 == 0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int emit_server_name_extension(ptls_buffer_t *buf, const char *server_name)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, PTLS_SERVER_NAME_TYPE_HOSTNAME);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, server_name, strlen(server_name)); });
    });

    ret = 0;
Exit:
    return ret;
}